

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.h
# Opt level: O2

void __thiscall beagle::plugin::Plugin::~Plugin(Plugin *this)

{
  this->_vptr_Plugin = (_func_int **)&PTR_pluginName_abi_cxx11__001585c0;
  std::__cxx11::string::~string((string *)&this->m_plugin_type);
  std::__cxx11::string::~string((string *)&this->m_plugin_name);
  std::__cxx11::_List_base<BeagleResource,_std::allocator<BeagleResource>_>::_M_clear
            (&(this->beagleResources).
              super__List_base<BeagleResource,_std::allocator<BeagleResource>_>);
  std::__cxx11::
  _List_base<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>::_M_clear
            (&(this->beagleFactories).
              super__List_base<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>
            );
  return;
}

Assistant:

class BEAGLE_DLLEXPORT Plugin
{
  public:
	Plugin() {}

    Plugin(const char* plugin_name, const char* plugin_type)
    : m_plugin_name(plugin_name), m_plugin_type(plugin_type) {}

    virtual std::string pluginName() const{ return m_plugin_name; }
    virtual std::string pluginType() const{ return m_plugin_type; }

    virtual const std::list<beagle::BeagleImplFactory*>& getBeagleFactories() const{ return beagleFactories; }
    virtual const std::list<BeagleResource>& getBeagleResources() const{ return beagleResources; }

protected:
    std::list<beagle::BeagleImplFactory*> beagleFactories;
    std::list<BeagleResource> beagleResources;
    std::string m_plugin_name;
    std::string m_plugin_type;
}